

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::runtime_cs_ext::wait_for(numeric *mill_sec,var *func,array *argument)

{
  initializer_list<cs_impl::any> __l;
  bool bVar1;
  callable *func_00;
  callable *mill_sec_00;
  string *str;
  numeric *in_RSI;
  proxy *in_RDI;
  vector args_1;
  object_method *om;
  vector args;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffde8;
  __normal_iterator<const_cs_impl::any_*,_std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_>
  *in_stack_fffffffffffffdf0;
  allocator *this;
  type_info *in_stack_fffffffffffffdf8;
  type_info *in_stack_fffffffffffffe00;
  allocator_type *in_stack_fffffffffffffe18;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffe20;
  iterator in_stack_fffffffffffffe28;
  size_type in_stack_fffffffffffffe30;
  undefined1 **local_1a0;
  allocator_type *in_stack_fffffffffffffe68;
  vector *args_00;
  callable *in_stack_fffffffffffffe70;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
  *in_stack_fffffffffffffe78;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffe80;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *this_00;
  const_iterator in_stack_fffffffffffffe88;
  allocator local_151;
  string local_150 [32];
  any *local_130;
  any *local_e8;
  undefined1 local_d1 [17];
  undefined1 *local_c0;
  undefined8 local_b8;
  object_method *local_98;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> local_58 [3];
  numeric *local_10;
  
  local_10 = in_RSI;
  any::type((any *)in_stack_fffffffffffffdf0);
  bVar1 = std::type_info::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (bVar1) {
    this_00 = local_58;
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin(in_stack_fffffffffffffde8);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end(in_stack_fffffffffffffde8);
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x2590de);
    std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
    vector<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
              (this_00,in_stack_fffffffffffffe78,
               (_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*> *)
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x259112);
    func_00 = (callable *)cs::numeric::as_integer(local_10);
    mill_sec_00 = any::const_val<cs::callable>((any *)func_00);
    wait_for_impl((size_t)mill_sec_00,func_00,(vector *)in_stack_fffffffffffffe68);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe00);
  }
  else {
    any::type((any *)in_stack_fffffffffffffdf0);
    bVar1 = std::type_info::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    if (!bVar1) {
      str = (string *)__cxa_allocate_exception(0x20);
      this = &local_151;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"Invoke non-callable object.",this);
      cs::lang_error::lang_error((lang_error *)this,str);
      __cxa_throw(str,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    local_98 = any::const_val<cs::object_method>((any *)in_stack_fffffffffffffe70);
    local_d1._1_8_ = local_d1 + 9;
    any::any((any *)in_stack_fffffffffffffdf0,(any *)in_stack_fffffffffffffde8);
    local_c0 = local_d1 + 9;
    local_b8 = 1;
    args_00 = (vector *)local_d1;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x25924d);
    __l._M_len = in_stack_fffffffffffffe30;
    __l._M_array = in_stack_fffffffffffffe28;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffe20,__l,in_stack_fffffffffffffe18);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x259281);
    local_1a0 = &local_c0;
    do {
      local_1a0 = local_1a0 + -1;
      any::~any((any *)0x2592aa);
    } while (local_1a0 != (undefined1 **)(local_d1 + 9));
    local_e8 = (any *)std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                                ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                                 in_stack_fffffffffffffde8);
    __gnu_cxx::
    __normal_iterator<cs_impl::any_const*,std::vector<cs_impl::any,std::allocator<cs_impl::any>>>::
    __normal_iterator<cs_impl::any*>
              (in_stack_fffffffffffffdf0,
               (__normal_iterator<cs_impl::any_*,_std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_>
                *)in_stack_fffffffffffffde8);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin(in_stack_fffffffffffffde8);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end(in_stack_fffffffffffffde8);
    local_130 = (any *)std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
                       insert<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
                                 (in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
                                  in_stack_fffffffffffffe78,
                                  (_Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
                                   *)in_stack_fffffffffffffe70);
    cs::numeric::as_integer(local_10);
    any::const_val<cs::callable>((any *)in_stack_fffffffffffffe70);
    wait_for_impl((size_t)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,args_00);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe00);
  }
  return (var)in_RDI;
}

Assistant:

cs::var wait_for(const cs::numeric& mill_sec, const cs::var &func, const cs::array &argument)
		{
			if (func.type() == typeid(cs::callable)) {
				cs::vector args(argument.begin(), argument.end());
				return wait_for_impl(mill_sec.as_integer(), func.const_val<cs::callable>(), args);
			}
			else if (func.type() == typeid(cs::object_method)) {
				const auto &om = func.const_val<cs::object_method>();
				cs::vector args{om.object};
				args.insert(args.end(), argument.begin(), argument.end());
				return wait_for_impl(mill_sec.as_integer(), om.callable.const_val<cs::callable>(), args);
			}
			else
				throw cs::lang_error("Invoke non-callable object.");
		}